

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int rs_restore_file(FILE *inf)

{
  bool local_1a;
  bool local_19;
  FILE *inf_local;
  
  if ((read_error == 0) && (format_error == 0)) {
    rs_read_boolean(inf,&after);
    rs_read_boolean(inf,&again);
    rs_read_boolean(inf,&seenstairs);
    rs_read_boolean(inf,&amulet);
    rs_read_boolean(inf,&door_stop);
    rs_read_boolean(inf,&fight_flush);
    rs_read_boolean(inf,&firstmove);
    rs_read_boolean(inf,&has_hit);
    rs_read_boolean(inf,&inv_describe);
    rs_read_boolean(inf,&jump);
    rs_read_boolean(inf,&kamikaze);
    rs_read_boolean(inf,&lower_msg);
    rs_read_boolean(inf,&move_on);
    rs_read_boolean(inf,&passgo);
    rs_read_boolean(inf,&playing);
    rs_read_boolean(inf,&running);
    rs_read_boolean(inf,&save_msg);
    rs_read_boolean(inf,&terse);
    rs_read_boolean(inf,&to_death);
    rs_read_booleans(inf,pack_used,0x1a);
    rs_read_int(inf,&dir_ch);
    rs_read_chars(inf,file_name,0x400);
    rs_read_chars(inf,huh,0x400);
    rs_read_potions(inf);
    rs_read_chars(inf,prbuf,0x800);
    rs_read_rings(inf);
    rs_read_int(inf,&runch);
    rs_read_scrolls(inf);
    rs_read_char(inf,&take);
    rs_read_sticks(inf);
    rs_read_int(inf,&l_last_comm);
    rs_read_int(inf,&l_last_dir);
    rs_read_int(inf,&last_comm);
    rs_read_int(inf,&last_dir);
    rs_read_int(inf,&n_objs);
    rs_read_int(inf,&hungry_state);
    rs_read_int(inf,&inv_type);
    rs_read_int(inf,&level);
    rs_read_int(inf,&max_level);
    rs_read_int(inf,&no_food);
    rs_read_ints(inf,a_class,8);
    rs_read_int(inf,&count);
    rs_read_int(inf,&food_left);
    rs_read_int(inf,&lastscore);
    rs_read_int(inf,&no_command);
    rs_read_int(inf,&no_move);
    rs_read_int(inf,&purse);
    rs_read_int(inf,&quiet);
    rs_read_int(inf,&vf_hit);
    rs_read_int(inf,&dnum);
    rs_read_ints(inf,e_levels,0x15);
    rs_read_coord(inf,&delta);
    rs_read_coord(inf,&oldpos);
    rs_read_coord(inf,&stairs);
    rs_read_thing(inf,&player);
    rs_read_object_reference(inf,&player.pack,&cur_armor);
    rs_read_object_reference(inf,&player.pack,cur_ring);
    rs_read_object_reference(inf,&player.pack,cur_ring + 1);
    rs_read_object_reference(inf,&player.pack,&cur_weapon);
    rs_read_object_reference(inf,&player.pack,&l_last_pick);
    rs_read_object_reference(inf,&player.pack,&last_pick);
    rs_read_object_list(inf,&lvl_obj_abi_cxx11_);
    rs_read_monster_list(inf);
    rs_fix_monster(&player);
    rs_fix_monster_list();
    rs_read_places(inf,places,0xa00);
    rs_read_stats(inf,&max_stats);
    rs_read_areas(inf);
    rs_read_monsters(inf,monsters,0x1a);
    rs_read_obj_info(inf,things,7);
    rs_read_obj_info(inf,food_info,7);
    rs_read_obj_info(inf,arm_info,8);
    rs_read_obj_info(inf,pot_info,0xe);
    rs_read_obj_info(inf,ring_info,0xe);
    rs_read_obj_info(inf,scr_info,0x13);
    rs_read_obj_info(inf,weap_info,10);
    rs_read_obj_info(inf,ws_info,0xe);
    rs_read_daemons(inf,d_list,0x14);
    rs_read_int(inf,&between);
    rs_read_int(inf,&group);
    rs_read_window(inf);
    local_1a = format_error != 0 || read_error != 0;
    local_19 = local_1a;
  }
  else {
    local_19 = format_error != 0 || read_error != 0;
  }
  inf_local._4_4_ = (uint)local_19;
  return inf_local._4_4_;
}

Assistant:

int rs_restore_file(FILE *inf)
{
    if (read_error || format_error)
        return(READSTAT);

    rs_read_boolean(inf, &after);               /* 1  */    /* extern.c */
    rs_read_boolean(inf, &again);               /* 2  */
    rs_read_boolean(inf, &seenstairs);          /* 4  */
    rs_read_boolean(inf, &amulet);              /* 5  */
    rs_read_boolean(inf, &door_stop);           /* 6  */
    rs_read_boolean(inf, &fight_flush);         /* 7  */
    rs_read_boolean(inf, &firstmove);           /* 8  */
    rs_read_boolean(inf, &has_hit);             /* 10 */
    rs_read_boolean(inf, &inv_describe);        /* 12 */
    rs_read_boolean(inf, &jump);                /* 13 */
    rs_read_boolean(inf, &kamikaze);            /* 14 */
    rs_read_boolean(inf, &lower_msg);           /* 15 */
    rs_read_boolean(inf, &move_on);             /* 16 */
    rs_read_boolean(inf, &passgo);              /* 18 */
    rs_read_boolean(inf, &playing);             /* 19 */
    rs_read_boolean(inf, &running);             /* 21 */
    rs_read_boolean(inf, &save_msg);            /* 22 */
    rs_read_boolean(inf, &terse);               /* 25 */
    rs_read_boolean(inf, &to_death);            /* 26 */
    rs_read_booleans(inf, pack_used, 26);       /* 29 */
    rs_read_int(inf, &dir_ch);
    rs_read_chars(inf, file_name, MAXSTR);
    rs_read_chars(inf, huh, MAXSTR);
    rs_read_potions(inf);
    rs_read_chars(inf, prbuf, 2*MAXSTR);
    rs_read_rings(inf);
    rs_read_int(inf, &runch);
    rs_read_scrolls(inf);
    rs_read_char(inf, &take);
    rs_read_sticks(inf);
    rs_read_int(inf, &l_last_comm);
    rs_read_int(inf, &l_last_dir);
    rs_read_int(inf, &last_comm);
    rs_read_int(inf, &last_dir);
    rs_read_int(inf, &n_objs);
    rs_read_int(inf, &hungry_state);
    rs_read_int(inf, &inv_type);
    rs_read_int(inf, &level);
    rs_read_int(inf, &max_level);
    rs_read_int(inf, &no_food);
    rs_read_ints(inf,a_class,MAXARMORS);
    rs_read_int(inf, &count);
    rs_read_int(inf, &food_left);
    rs_read_int(inf, &lastscore);
    rs_read_int(inf, &no_command);
    rs_read_int(inf, &no_move);
    rs_read_int(inf, &purse);
    rs_read_int(inf, &quiet);
    rs_read_int(inf, &vf_hit);
    rs_read_int(inf, &dnum);
    rs_read_ints(inf,e_levels,21);
    rs_read_coord(inf, &delta);
    rs_read_coord(inf, &oldpos);
    rs_read_coord(inf, &stairs);

    rs_read_thing(inf, &player); 
    rs_read_object_reference(inf, player.pack, &cur_armor);
    rs_read_object_reference(inf, player.pack, &cur_ring[0]);
    rs_read_object_reference(inf, player.pack, &cur_ring[1]);
    rs_read_object_reference(inf, player.pack, &cur_weapon);
    rs_read_object_reference(inf, player.pack, &l_last_pick);
    rs_read_object_reference(inf, player.pack, &last_pick);

    rs_read_object_list(inf, lvl_obj);
    rs_read_monster_list(inf);                  
    rs_fix_monster(&player);
    rs_fix_monster_list();

    rs_read_places(inf,places,MAXLINES*MAXCOLS);

    rs_read_stats(inf, &max_stats);
    rs_read_areas(inf);

    rs_read_monsters(inf,monsters,26);                  
    rs_read_obj_info(inf, things,   NUMITEMTYPES);         
    rs_read_obj_info(inf, food_info, MAXFOODS);  
    rs_read_obj_info(inf, arm_info,  MAXARMORS);         
    rs_read_obj_info(inf, pot_info,  MAXPOTIONS);       
    rs_read_obj_info(inf, ring_info, MAXRINGS);         
    rs_read_obj_info(inf, scr_info,  MAXSCROLLS);       
    rs_read_obj_info(inf, weap_info, MAXWEAPONS+1);       
    rs_read_obj_info(inf, ws_info,   MAXSTICKS);       

    rs_read_daemons(inf, d_list, 20);                   /* 5.4-daemon.c     */
    rs_read_int(inf,&between);                          /* 5.4-daemons.c    */
    rs_read_int(inf,&group);                            /* 5.4-weapons.c    */
    
    rs_read_window(inf);

    return(READSTAT);
}